

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int scanNumber(char **ptr)

{
  bool bVar1;
  char *local_20;
  char *cur;
  int ret;
  char **ptr_local;
  
  cur._4_4_ = 0;
  local_20 = *ptr;
  while( true ) {
    bVar1 = false;
    if ('/' < *local_20) {
      bVar1 = *local_20 < ':';
    }
    if (!bVar1) break;
    cur._4_4_ = cur._4_4_ * 10 + *local_20 + -0x30;
    local_20 = local_20 + 1;
  }
  *ptr = local_20;
  return cur._4_4_;
}

Assistant:

static int scanNumber(char **ptr) {
    int ret = 0;
    char *cur;

    cur = *ptr;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	cur++;
    }
    *ptr = cur;
    return(ret);
}